

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O3

void __thiscall zsummer::log4z::CLogerManager::CLogerManager(CLogerManager *this)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  long lVar3;
  key_type local_50;
  
  lVar3 = 0;
  (this->super_CThread).m_hThreadID = 0;
  (this->super_CThread)._vptr_CThread = (_func_int **)&PTR__CLogerManager_0014cb18;
  (this->super_ILog4zManager)._vptr_ILog4zManager = (_func_int **)&PTR__CLogerManager_0014cbc8;
  (this->m_semaphore)._vptr_CSem = (_func_int **)&PTR__CSem_0014ccc8;
  (this->m_semaphore).m_bCreate = false;
  (this->m_configFile)._M_dataplus._M_p = (pointer)&(this->m_configFile).field_2;
  (this->m_configFile)._M_string_length = 0;
  (this->m_configFile).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->m_ids)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ids)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ids)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_ids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_ids)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_ids)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  do {
    LoggerInfo::LoggerInfo((LoggerInfo *)((long)&this->m_loggers[0]._name._M_dataplus._M_p + lVar3))
    ;
    lVar3 = lVar3 + 0x88;
  } while (lVar3 != 0x550);
  (this->m_logs).
  super__List_base<zsummer::log4z::LogData_*,_std::allocator<zsummer::log4z::LogData_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_logs;
  (this->m_logs).
  super__List_base<zsummer::log4z::LogData_*,_std::allocator<zsummer::log4z::LogData_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_logs;
  (this->m_logs).
  super__List_base<zsummer::log4z::LogData_*,_std::allocator<zsummer::log4z::LogData_*>_>._M_impl.
  _M_node._M_size = 0;
  CLock::CLock(&this->m_lock);
  this->m_bRuning = false;
  this->m_lastId = 0;
  GetProcessInfo(&this->m_loggers[0]._name,&this->m_loggers[0]._pid);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Main","");
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->m_ids,&local_50);
  *pmVar2 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this->m_ullStatusTotalPushLog = 0;
  this->m_ullStatusTotalPopLog = 0;
  this->m_ullStatusTotalWriteFileCount = 0;
  this->m_ullStatusTotalWriteFileBytes = 0;
  return;
}

Assistant:

CLogerManager()
	{
		m_bRuning = false;
		m_lastId = LOG4Z_MAIN_LOGGER_ID;
		GetProcessInfo(m_loggers[LOG4Z_MAIN_LOGGER_ID]._name, m_loggers[LOG4Z_MAIN_LOGGER_ID]._pid);
		m_ids[LOG4Z_MAIN_LOGGER_NAME] = LOG4Z_MAIN_LOGGER_ID;

		m_ullStatusTotalPushLog = 0;
		m_ullStatusTotalPopLog = 0;
		m_ullStatusTotalWriteFileCount = 0;
		m_ullStatusTotalWriteFileBytes = 0;
	}